

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O1

void basic_suite::test_integer_const(void)

{
  bool bVar1;
  int iVar2;
  char input [2];
  reader reader;
  uint local_170;
  char local_16a [2];
  view_type local_168;
  basic_reader<char> local_158;
  
  local_16a[0] = '1';
  local_16a[1] = '\0';
  local_168._M_len = strlen(local_16a);
  local_168._M_str = local_16a;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_168);
  local_170 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x6d,"void basic_suite::test_integer_const()",&local_168,&local_170);
  iVar2 = trial::protocol::json::basic_reader<char>::value<int_const>(&local_158);
  local_168._M_len = CONCAT44(local_168._M_len._4_4_,iVar2);
  local_170 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<const int>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x6e,"void basic_suite::test_integer_const()",&local_168,&local_170);
  local_168._M_len =
       (long)local_158.decoder.current.view.tail - (long)local_158.decoder.current.view.head;
  local_168._M_str = local_158.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"1\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x6f,"void basic_suite::test_integer_const()",&local_168,"1");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
  local_168._M_len = CONCAT71(local_168._M_len._1_7_,bVar1);
  local_170 = local_170 & 0xffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x70,"void basic_suite::test_integer_const()",&local_168,&local_170);
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_integer_const()
{
    const char input[] = "1";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<const int>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "1");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
}